

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[18],int,long>
          (String *__return_storage_ptr__,kj *this,char (*params) [18],int *params_1,long *params_2)

{
  char (*value) [18];
  int *value_00;
  long *value_01;
  CappedArray<char,_26UL> local_78;
  CappedArray<char,_14UL> local_50;
  ArrayPtr<const_char> local_38;
  NoInfer<long> *local_28;
  long *params_local_2;
  int *params_local_1;
  char (*params_local) [18];
  
  local_28 = (NoInfer<long> *)params_1;
  params_local_2 = (long *)params;
  params_local_1 = (int *)this;
  params_local = (char (*) [18])__return_storage_ptr__;
  value = ::const((char (*) [18])this);
  local_38 = toCharSequence<char_const(&)[18]>(value);
  value_00 = fwd<int>((NoInfer<int> *)params_local_2);
  toCharSequence<int>(&local_50,value_00);
  value_01 = fwd<long>(local_28);
  toCharSequence<long>(&local_78,value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)&local_50,
             (CappedArray<char,_14UL> *)&local_78,(CappedArray<char,_26UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}